

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinder_Specifiers.cpp
# Opt level: O0

Action __thiscall
psy::C::DeclarationBinder::visit_AtSpecifiers_COMMON<psy::C::VariableAndOrFunctionDeclarationSyntax>
          (DeclarationBinder *this,VariableAndOrFunctionDeclarationSyntax *node,
          offset_in_DeclarationBinder_to_subr visit_AtDeclarators)

{
  Action AVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  Type *ty;
  undefined4 extraout_var_00;
  offset_in_DeclarationBinder_to_subr in_RCX;
  long *plVar4;
  SpecifierListSyntax *local_c8;
  SpecifierListSyntax *local_98;
  SpecifierListSyntax *specIt_1;
  SyntaxToken local_80;
  SpecifierListSyntax *local_48;
  SpecifierListSyntax *specIt;
  offset_in_DeclarationBinder_to_subr visit_AtDeclarators_local;
  VariableAndOrFunctionDeclarationSyntax *local_30;
  VariableAndOrFunctionDeclarationSyntax *node_local;
  DeclarationBinder *this_local;
  
  *(byte *)&this->field_7 = *(byte *)&this->field_7 & 0xfd;
  *(byte *)&this->field_7 = *(byte *)&this->field_7 & 0xfb;
  *(byte *)&this->field_7 = *(byte *)&this->field_7 & 0xf7;
  specIt = (SpecifierListSyntax *)visit_AtDeclarators;
  visit_AtDeclarators_local = in_RCX;
  local_30 = node;
  node_local = (VariableAndOrFunctionDeclarationSyntax *)this;
  this_local = (DeclarationBinder *)visit_AtDeclarators;
  local_48 = VariableAndOrFunctionDeclarationSyntax::specifiers(node);
  while( true ) {
    if (local_48 == (SpecifierListSyntax *)0x0) {
      bVar2 = std::
              stack<psy::C::Type_*,_std::deque<psy::C::Type_*,_std::allocator<psy::C::Type_*>_>_>::
              empty(&this->tys_);
      if (bVar2) {
        C::SyntaxNode::lastToken(&local_80,(SyntaxNode *)local_30);
        DiagnosticsReporter::TypeSpecifierMissingDefaultsToInt(&this->diagReporter_,&local_80);
        SyntaxToken::~SyntaxToken(&local_80);
        ty = &makeType<psy::C::BasicType,psy::C::BasicTypeKind>(this,Int_S)->super_Type;
        pushType(this,ty);
      }
      local_98 = VariableAndOrFunctionDeclarationSyntax::specifiers(local_30);
      while( true ) {
        if (local_98 == (SpecifierListSyntax *)0x0) {
          plVar4 = (long *)((long)&(this->super_SyntaxVisitor)._vptr_SyntaxVisitor +
                           visit_AtDeclarators_local);
          if (((ulong)specIt & 1) == 0) {
            local_c8 = specIt;
          }
          else {
            local_c8 = *(SpecifierListSyntax **)((long)specIt + *plVar4 + -1);
          }
          AVar1 = (*(code *)local_c8)(plVar4,local_30);
          return AVar1;
        }
        iVar3 = (*(((local_98->
                    super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                    ).
                    super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                   .value)->super_SyntaxNode).super_Managed._vptr_Managed[0x3a])();
        if ((CONCAT44(extraout_var_00,iVar3) != 0) &&
           (AVar1 = SyntaxVisitor::visit
                              (&this->super_SyntaxVisitor,
                               &((local_98->
                                 super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                                 ).
                                 super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                                .value)->super_SyntaxNode), AVar1 == Quit)) break;
        local_98 = (local_98->
                   super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                   ).
                   super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                   .next;
      }
      return Quit;
    }
    iVar3 = (*(((local_48->
                super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                ).
                super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
               .value)->super_SyntaxNode).super_Managed._vptr_Managed[0x3a])();
    if ((CONCAT44(extraout_var,iVar3) == 0) &&
       (AVar1 = SyntaxVisitor::visit
                          (&this->super_SyntaxVisitor,
                           &((local_48->
                             super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                             ).
                             super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                            .value)->super_SyntaxNode), AVar1 == Quit)) break;
    local_48 = (local_48->
               super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
               ).
               super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
               .next;
  }
  return Quit;
}

Assistant:

SyntaxVisitor::Action DeclarationBinder::visit_AtSpecifiers_COMMON(
        const NodeT* node,
        Action (DeclarationBinder::*visit_AtDeclarators)(const NodeT*))
{
    F_.inImplicitIntTySpec_ = false;
    F_.inImplicitDoubleTySpec_ = false;
    F_.inExplicitSignedOrUnsignedTySpec_ = false;

    for (auto specIt = node->specifiers(); specIt; specIt = specIt->next) {
        if (!specIt->value->asTypeQualifier())
            VISIT(specIt->value);
    }

    if (tys_.empty()) {
        diagReporter_.TypeSpecifierMissingDefaultsToInt(node->lastToken());
        pushType(makeType<BasicType>(BasicTypeKind::Int_S));
    }

    for (auto specIt = node->specifiers(); specIt; specIt = specIt->next) {
        if (specIt->value->asTypeQualifier())
            VISIT(specIt->value);
    }

    return ((this)->*(visit_AtDeclarators))(node);
}